

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreState.h
# Opt level: O0

void __thiscall
axl::sl::BoyerMooreStateBase<char>::advance<false>
          (BoyerMooreStateBase<char> *this,size_t i,char *p,size_t length)

{
  char *p_00;
  long lVar1;
  void *__buf;
  CircularBufferBase<char> *in_RCX;
  int in_EDX;
  char *in_RSI;
  long *in_RDI;
  size_t result_1;
  size_t result;
  size_t copyLength;
  size_t tailLength;
  size_t in_stack_ffffffffffffffc8;
  CircularBufferBase<char> *in_stack_ffffffffffffffd0;
  
  *in_RDI = (long)(in_RSI + *in_RDI);
  p_00 = (char *)CircularBufferBase<char>::getDataLength((CircularBufferBase<char> *)(in_RDI + 1));
  if (in_RSI < p_00) {
    CircularBufferBase<char>::dropFront(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    CircularBufferBase<char>::writeBack(in_RCX,p_00,(size_t)in_stack_ffffffffffffffd0);
  }
  else {
    lVar1 = (long)in_RSI - (long)p_00;
    __buf = (void *)((long)in_RCX - lVar1);
    CircularBufferBase<char>::clear((CircularBufferBase<char> *)(in_RDI + 1));
    CircularBufferBase<char>::write
              ((CircularBufferBase<char> *)(in_RDI + 1),in_EDX + (int)lVar1,__buf,(size_t)p_00);
  }
  return;
}

Assistant:

void
	advance(
		size_t i,
		const C* p,
		size_t length
	) {
		m_offset += i;

		size_t tailLength = m_tail.getDataLength();
		if (i >= tailLength) {
			i -= tailLength;
			size_t copyLength = length - i;
			m_tail.clear();
			size_t result = m_tail.write(
				IsReverse ?
					p + length - copyLength - i :
					p + i,
				copyLength
			);
			ASSERT(result == copyLength);
		} else if (IsReverse) {
			m_tail.dropBack(i);
			size_t result = m_tail.writeFront(p, length);
			ASSERT(result == length);
		} else {
			m_tail.dropFront(i);
			size_t result = m_tail.writeBack(p, length);
			ASSERT(result == length);
		}
	}